

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btConvexHull.cpp
# Opt level: O3

int above(btVector3 *vertices,int3 *t,btVector3 *p,btScalar epsilon)

{
  int iVar1;
  btVector3 bVar2;
  
  iVar1 = t->x;
  bVar2 = TriNormal(vertices + iVar1,vertices + t->y,vertices + t->z);
  return (int)(epsilon <
              (p->m_floats[2] - vertices[iVar1].m_floats[2]) * bVar2.m_floats[2] +
              (p->m_floats[0] - vertices[iVar1].m_floats[0]) * bVar2.m_floats[0] +
              bVar2.m_floats[1] * (p->m_floats[1] - vertices[iVar1].m_floats[1]));
}

Assistant:

int above(btVector3* vertices,const int3& t, const btVector3 &p, btScalar epsilon) 
{
	btVector3 n=TriNormal(vertices[t[0]],vertices[t[1]],vertices[t[2]]);
	return (btDot(n,p-vertices[t[0]]) > epsilon); // EPSILON???
}